

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

bool __thiscall
cmELFInternalImpl<cmELFTypes32>::LoadSectionHeader(cmELFInternalImpl<cmELFTypes32> *this,ELF_Half i)

{
  istream *piVar1;
  bool bVar2;
  reference pvVar3;
  fpos<__mbstate_t> local_30;
  ELF_Half local_1a;
  cmELFInternalImpl<cmELFTypes32> *pcStack_18;
  ELF_Half i_local;
  cmELFInternalImpl<cmELFTypes32> *this_local;
  
  piVar1 = (this->super_cmELFInternal).Stream;
  local_1a = i;
  pcStack_18 = this;
  std::fpos<__mbstate_t>::fpos
            (&local_30,
             (ulong)((this->ELFHeader).e_shoff + (uint)(this->ELFHeader).e_shentsize * (uint)i));
  std::istream::seekg(piVar1,local_30._M_off,local_30._M_state);
  pvVar3 = std::vector<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>::operator[]
                     (&this->SectionHeaders,(ulong)local_1a);
  bVar2 = Read(this,pvVar3);
  if (bVar2) {
    pvVar3 = std::vector<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>::operator[]
                       (&this->SectionHeaders,(ulong)local_1a);
    if (pvVar3->sh_type == 6) {
      (this->super_cmELFInternal).DynamicSectionIndex = (uint)local_1a;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool LoadSectionHeader(ELF_Half i)
    {
    // Read the section header from the file.
    this->Stream.seekg(this->ELFHeader.e_shoff +
                       this->ELFHeader.e_shentsize * i);
    if(!this->Read(this->SectionHeaders[i]))
      {
      return false;
      }

    // Identify some important sections.
    if(this->SectionHeaders[i].sh_type == SHT_DYNAMIC)
      {
      this->DynamicSectionIndex = i;
      }
    return true;
    }